

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_server.c
# Opt level: O0

skynet_context * skynet_context_release(skynet_context *ctx)

{
  int *piVar1;
  int iVar2;
  skynet_context *ctx_local;
  
  LOCK();
  piVar1 = &ctx->ref;
  iVar2 = *piVar1;
  *piVar1 = *piVar1 + -1;
  UNLOCK();
  ctx_local = ctx;
  if (iVar2 == 1) {
    delete_context(ctx);
    ctx_local = (skynet_context *)0x0;
  }
  return ctx_local;
}

Assistant:

struct skynet_context * 
skynet_context_release(struct skynet_context *ctx) {
	if (ATOM_DEC(&ctx->ref) == 0) {
		delete_context(ctx);
		return NULL;
	}
	return ctx;
}